

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall soul::heart::Constant::Constant(Constant *this,CodeLocation *l,Value *v)

{
  Category CVar1;
  bool bVar2;
  bool bVar3;
  BoundedIntSize BVar4;
  CodeLocation local_28;
  
  local_28.sourceCode.object = (l->sourceCode).object;
  local_28.location.data = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  Expression::Expression(&this->super_Expression,&local_28);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  (this->super_Expression).super_Object._vptr_Object = (_func_int **)&PTR__Constant_002faf58;
  CVar1 = (v->type).arrayElementCategory;
  bVar2 = (v->type).isRef;
  bVar3 = (v->type).isConstant;
  (this->value).type.category = (v->type).category;
  (this->value).type.arrayElementCategory = CVar1;
  (this->value).type.isRef = bVar2;
  (this->value).type.isConstant = bVar3;
  (this->value).type.primitiveType.type = (v->type).primitiveType.type;
  BVar4 = (v->type).arrayElementBoundingSize;
  (this->value).type.boundingSize = (v->type).boundingSize;
  (this->value).type.arrayElementBoundingSize = BVar4;
  (this->value).type.structure.object = (v->type).structure.object;
  (v->type).structure.object = (Structure *)0x0;
  (this->value).allocatedData.allocatedSize = (v->allocatedData).allocatedSize;
  ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
            (&(this->value).allocatedData.allocatedData,&(v->allocatedData).allocatedData);
  return;
}

Assistant:

Constant (CodeLocation l, Value v) : Expression (std::move (l)), value (std::move (v)) {}